

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O2

void * qp_pop_ptr(priority_queue *qp)

{
  ulong uVar1;
  priority_queue_element *ppVar2;
  void *pvVar3;
  anon_union_8_2_94730108_for_payload aVar4;
  size_t in_RSI;
  
  if (((qp != (priority_queue *)0x0) && (uVar1 = qp->count, uVar1 != 0)) && (uVar1 <= qp->size)) {
    ppVar2 = qp->data;
    pvVar3 = (ppVar2->payload).p;
    qp->count = uVar1 - 1;
    aVar4 = (&ppVar2[uVar1 - 1].payload)[1];
    ppVar2->payload = ppVar2[uVar1 - 1].payload;
    *(anon_union_8_2_94730108_for_payload *)&ppVar2->priority = aVar4;
    down_heap(qp,in_RSI);
    return pvVar3;
  }
  __assert_fail("qp && qp->count > 0 && qp->count <= qp->size",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-queue.c"
                ,0x182,"void *qp_pop_ptr(struct priority_queue *)");
}

Assistant:

void *qp_pop_ptr(struct priority_queue *qp)
{
	void *result;

	assert(qp && qp->count > 0 && qp->count <= qp->size);
	result = qp->data[0].payload.p;
	--qp->count;
	qp->data[0] = qp->data[qp->count];
	down_heap(qp, 0);
	return result;
}